

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

BrushData parseBrushValue(Value *v,QPalette *pal)

{
  QVariant *this;
  _Head_base<0UL,_QBrushData_*,_false> _Var1;
  bool bVar2;
  ColorRole CVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CoordinateMode CVar8;
  QBrush *pQVar9;
  Node<QString,_double> *pNVar10;
  double *pdVar11;
  int iVar12;
  undefined1 *puVar13;
  long lVar14;
  int iVar15;
  QPalette *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Symbol *pSVar16;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  CoordinateMode CVar17;
  long lVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  long in_FS_OFFSET;
  byte bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  BrushData BVar48;
  Parser parser;
  Value value;
  Value color;
  QLatin1String local_278;
  undefined1 local_268 [32];
  undefined1 *local_248;
  QArrayData *pQStack_240;
  char16_t *local_238;
  undefined1 *puStack_230;
  QString local_228;
  QArrayDataPointer<QString> local_208;
  QHash<QString,_double> local_1f0;
  QArrayDataPointer<QString> local_1e8;
  QGradientStops local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<QString> local_188;
  pair<double,_QColor> local_168;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined1 local_108 [32];
  QGradientData local_e8;
  Value local_b0;
  undefined1 local_88 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_80;
  undefined8 local_68;
  Value local_60;
  long local_38;
  
  bVar21 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60.type = *(Type *)&pal->d;
  QVariant::QVariant(&local_60.variant,(QVariant *)&pal->currentGroup);
  parseColorValue((ColorData *)local_128,&local_60);
  QVariant::~QVariant(&local_60.variant);
  if (local_118._4_4_ == Role) {
    CVar3 = (ColorRole)local_118;
    QBrush::QBrush((QBrush *)v);
    *(ColorRole *)&(v->variant).d.data = CVar3;
    *(undefined4 *)((long)&(v->variant).d.data + 4) = 2;
    uVar25 = extraout_RDX_00;
  }
  else if (local_118._4_4_ == Color) {
    QBrush::QBrush((QBrush *)local_108,(QColor *)local_128,SolidPattern);
    QBrush::QBrush((QBrush *)v,(QBrush *)local_108);
    (v->variant).d.data.shared = (PrivateShared *)0x100000011;
    QBrush::~QBrush((QBrush *)local_108);
    uVar25 = extraout_RDX;
  }
  else if (*(int *)&pal->d == 9) {
    local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QVariant::toStringList();
    if ((undefined1 *)local_188.size == (undefined1 *)0x2) {
      local_1a8.d = (Data *)0x0;
      local_1a8.ptr = (QString *)0x0;
      local_1a8.size = 0;
      QVar31.m_data = (storage_type *)0xf;
      QVar31.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar31);
      local_268._0_8_ = local_108._0_8_;
      local_268._8_8_ = local_108._8_8_;
      local_268._16_8_ = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_268);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar32.m_data = (storage_type *)0xf;
      QVar32.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar32);
      local_88 = (undefined1  [8])local_108._0_8_;
      aStack_80.shared = (PrivateShared *)local_108._8_8_;
      aStack_80._8_8_ = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_88);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar33.m_data = (storage_type *)0x10;
      QVar33.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar33);
      local_1c8.d.d = (Data *)local_108._0_8_;
      local_1c8.d.ptr = (pair<double,_QColor> *)local_108._8_8_;
      local_1c8.d.size = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)&local_1c8);
      QList<QString>::end((QList<QString> *)&local_1a8);
      QVar34.m_data = (storage_type *)0x9;
      QVar34.m_size = (qsizetype)local_108;
      QString::fromLatin1(QVar34);
      local_1e8.d = (Data *)local_108._0_8_;
      local_1e8.ptr = (QString *)local_108._8_8_;
      local_1e8.size = local_108._16_8_;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)&local_1e8);
      QList<QString>::end((QList<QString> *)&local_1a8);
      if ((QBrushData *)local_1e8.d != (QBrushData *)0x0) {
        LOCK();
        ((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1e8.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QBrushData *)local_1c8.d.d != (QBrushData *)0x0) {
        LOCK();
        ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
        }
      }
      QString::toLower_helper((QString *)local_108);
      QVar45.m_data = (storage_type_conflict *)local_108._8_8_;
      QVar45.m_size = local_108._16_8_;
      iVar6 = QtPrivate::QStringList_indexOf((QList_conflict *)&local_1a8,QVar45,0,CaseSensitive);
      if ((QBrushData *)local_108._0_8_ != (QBrushData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      if (iVar6 != -1) {
        local_1f0.d = (Data<QHashPrivate::Node<QString,_double>_> *)0x0;
        local_1c8.d.d = (Data *)0x0;
        local_1c8.d.ptr = (pair<double,_QColor> *)0x0;
        local_1c8.d.size = 0;
        local_1e8.d = (Data *)0x0;
        local_1e8.ptr = (QString *)0x0;
        local_1e8.size = 0;
        QVar35.m_data = (storage_type *)0x3;
        QVar35.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar35);
        local_268._0_8_ = local_108._0_8_;
        local_268._8_8_ = local_108._8_8_;
        local_268._16_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)local_268);
        QList<QString>::end((QList<QString> *)&local_1e8);
        QVar36.m_data = (storage_type *)0x7;
        QVar36.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar36);
        local_88 = (undefined1  [8])local_108._0_8_;
        aStack_80.shared = (PrivateShared *)local_108._8_8_;
        aStack_80._8_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)local_88);
        QList<QString>::end((QList<QString> *)&local_1e8);
        QVar37.m_data = &DAT_00000006;
        QVar37.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar37);
        local_208.d = (Data *)local_108._0_8_;
        local_208.ptr = (QString *)local_108._8_8_;
        local_208.size = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)&local_208);
        QList<QString>::end((QList<QString> *)&local_1e8);
        if ((QBrushData *)local_208.d != (QBrushData *)0x0) {
          LOCK();
          ((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_208.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_208.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
          }
        }
        local_208.d = (Data *)0x0;
        local_208.ptr = (QString *)0x0;
        local_208.size = 0;
        QVar38.m_data = (storage_type *)0x7;
        QVar38.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar38);
        local_268._0_8_ = local_108._0_8_;
        local_268._8_8_ = local_108._8_8_;
        local_268._16_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_268);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar39.m_data = (storage_type *)0xf;
        QVar39.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar39);
        local_88 = (undefined1  [8])local_108._0_8_;
        aStack_80.shared = (PrivateShared *)local_108._8_8_;
        aStack_80._8_8_ = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_88);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar40.m_data = (storage_type *)0xe;
        QVar40.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar40);
        local_228.d.d = (Data *)local_108._0_8_;
        local_228.d.ptr = (char16_t *)local_108._8_8_;
        local_228.d.size = local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,&local_228);
        QList<QString>::end((QList<QString> *)&local_208);
        QVar41.m_data = &DAT_00000006;
        QVar41.m_size = (qsizetype)local_108;
        QString::fromLatin1(QVar41);
        local_148._0_8_ = local_108._0_8_;
        local_148._8_8_ = local_108._8_8_;
        local_138 = (undefined1 *)local_108._16_8_;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_208,local_208.size,(QString *)local_148);
        QList<QString>::end((QList<QString> *)&local_208);
        if ((QBrushData *)local_148._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
          }
        }
        if ((QBrushData *)local_228.d.d != (QBrushData *)0x0) {
          LOCK();
          ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if ((QBrushData *)local_268._0_8_ != (QBrushData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
          }
        }
        local_238 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_230 = &DAT_aaaaaaaaaaaaaaaa;
        local_248 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_240 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        local_268._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_268._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Parser::Parser((Parser *)local_268,local_188.ptr + 1,false);
        this = (QVariant *)(local_108 + 8);
        CVar8 = ~LogicalMode;
        bVar2 = false;
        iVar7 = -1;
        while( true ) {
          puVar13 = (undefined1 *)(long)(int)local_268._24_4_;
          if ((long)local_268._16_8_ <= (long)puVar13) break;
          pSVar16 = (Symbol *)(local_268._8_8_ + puVar13 * 0x28);
          iVar15 = local_268._24_4_;
          do {
            iVar15 = iVar15 + 1;
            if (pSVar16->token != S) break;
            puVar13 = puVar13 + 1;
            local_268._24_4_ = iVar15;
            pSVar16 = pSVar16 + 1;
          } while ((undefined1 *)local_268._16_8_ != puVar13);
          if (((long)local_268._16_8_ <= (long)(int)local_268._24_4_) ||
             (((Symbol *)(local_268._8_8_ + (long)(int)local_268._24_4_ * 0x28))->token != IDENT)) {
LAB_005e8693:
            QBrush::QBrush((QBrush *)v);
            (v->variant).d.data._forAlignment = 8.39911597930119e-323;
            goto LAB_005e86a3;
          }
          iVar15 = local_268._24_4_ + 1;
          local_268._24_4_ = iVar15;
          local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QCss::Symbol::lexem(&local_228,(Symbol *)(local_268._8_8_ + ((long)iVar15 + -1) * 0x28));
          lVar18 = (long)(int)local_268._24_4_;
          lVar14 = local_268._16_8_ - lVar18;
          if (lVar14 != 0 && lVar18 <= (long)local_268._16_8_) {
            pSVar16 = (Symbol *)(local_268._8_8_ + lVar18 * 0x28);
            iVar15 = local_268._24_4_;
            do {
              iVar15 = iVar15 + 1;
              if (pSVar16->token != S) break;
              local_268._24_4_ = iVar15;
              pSVar16 = pSVar16 + 1;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          lVar14 = (long)(int)local_268._24_4_;
          if ((lVar14 < (long)local_268._16_8_) &&
             (((Symbol *)(local_268._8_8_ + lVar14 * 0x28))->token == COLON)) {
            lVar14 = lVar14 + 1;
            lVar18 = local_268._16_8_ - lVar14;
            iVar15 = (int)lVar14;
            if (lVar18 != 0 && lVar14 <= (long)local_268._16_8_) {
              pSVar16 = (Symbol *)(local_268._8_8_ + lVar14 * 0x28);
              iVar4 = local_268._24_4_ + 2;
              local_268._24_4_ = (int)lVar14;
              do {
                iVar12 = iVar4;
                iVar15 = local_268._24_4_;
                if (pSVar16->token != S) break;
                pSVar16 = pSVar16 + 1;
                lVar18 = lVar18 + -1;
                iVar4 = iVar12 + 1;
                local_268._24_4_ = iVar12;
                iVar15 = iVar12;
              } while (lVar18 != 0);
            }
            local_268._24_4_ = iVar15;
            QVar42.m_data = (char *)0x4;
            QVar42.m_size = (qsizetype)&local_228;
            iVar15 = QString::compare(QVar42,0x6cf264);
            if (iVar15 == 0) {
              local_108._0_8_ =
                   (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)
                   0xaaaaaaaa00000000;
              local_108._24_8_ = 0;
              local_108._8_8_ = (Symbol *)0x0;
              local_108._16_8_ = (undefined1 *)0x0;
              local_e8.linear.x1 = 9.88131291682493e-324;
              local_88 = (undefined1  [8])0xaaaaaaaa00000000;
              aStack_80._16_8_ = 0;
              aStack_80.shared = (PrivateShared *)0x0;
              aStack_80._8_8_ = (undefined1 *)0x0;
              local_68 = 2;
              local_268._24_4_ = local_268._24_4_ + 1;
              bVar5 = QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_108);
              if (bVar5) {
                lVar18 = (long)(int)local_268._24_4_;
                lVar14 = local_268._16_8_ - lVar18;
                if (lVar14 != 0 && lVar18 <= (long)local_268._16_8_) {
                  pSVar16 = (Symbol *)(local_268._8_8_ + lVar18 * 0x28);
                  iVar15 = local_268._24_4_;
                  do {
                    iVar15 = iVar15 + 1;
                    if (pSVar16->token != S) break;
                    local_268._24_4_ = iVar15;
                    pSVar16 = pSVar16 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
                local_268._24_4_ = local_268._24_4_ + 1;
                bVar5 = QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_88);
                if (!bVar5) goto LAB_005e83dd;
                local_138 = &DAT_aaaaaaaaaaaaaaaa;
                local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_b0.type = local_88._0_4_;
                QVariant::QVariant(&local_b0.variant,(QVariant *)&aStack_80);
                parseColorValue((ColorData *)local_148,&local_b0);
                QVariant::~QVariant(&local_b0.variant);
                if (local_138._4_4_ == Role) {
                  bVar2 = true;
                }
                uVar25 = QVariant::toReal((bool *)this);
                if (local_138._4_4_ == Role) {
                  pQVar9 = QPalette::brush(in_RDX,Current,(ColorRole)local_138);
                  _Var1._M_head_impl =
                       (pQVar9->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                       _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
                  local_168.first._0_4_ = ((_Var1._M_head_impl)->color).cspec;
                  uVar23 = *(undefined4 *)((long)&(_Var1._M_head_impl)->color + 4);
                  local_168.second.cspec = *(Spec *)((long)&(_Var1._M_head_impl)->color + 8);
                  local_168.second.ct.argb.alpha =
                       (ushort)*(undefined4 *)((long)&(_Var1._M_head_impl)->color + 0xc);
LAB_005e84ca:
                  local_168.first._4_2_ = (ushort)uVar23;
                  local_168.first._6_2_ = (ushort)((uint)uVar23 >> 0x10);
                }
                else {
                  if (local_138._4_4_ == Color) {
                    local_168.first._0_4_ = local_148._0_4_;
                    uVar23 = local_148._4_4_;
                    local_168.second.cspec = local_148._8_4_;
                    local_168.second.ct.argb.alpha = local_148._12_2_;
                    goto LAB_005e84ca;
                  }
                  local_168.first._0_4_ = Invalid;
                  local_168.first._4_2_ = 0xffff;
                  local_168.first._6_2_ = 0;
                  local_168.second.cspec = Invalid;
                  local_168.second.ct.argb.alpha = 0;
                }
                local_168.second.ct.argb.pad = local_168.second.ct.argb.alpha;
                local_168.second.ct._4_4_ = local_168.second.cspec;
                local_168.second.ct.argb.red = local_168.first._6_2_;
                local_168.second.ct.argb.alpha = local_168.first._4_2_;
                local_168.first._4_2_ = (ushort)((ulong)uVar25 >> 0x20);
                local_168.first._6_2_ = (ushort)((ulong)uVar25 >> 0x30);
                local_168.second.cspec = local_168.first._0_4_;
                local_168.first._0_4_ = (int)uVar25;
                QtPrivate::QMovableArrayOps<std::pair<double,QColor>>::
                emplace<std::pair<double,QColor>>
                          ((QMovableArrayOps<std::pair<double,QColor>> *)&local_1c8,local_1c8.d.size
                           ,&local_168);
                QList<std::pair<double,_QColor>_>::end
                          ((QList<std::pair<double,_QColor>_> *)&local_1c8);
                bVar5 = true;
              }
              else {
LAB_005e83dd:
                QBrush::QBrush((QBrush *)v);
                (v->variant).d.data._forAlignment = 8.39911597930119e-323;
                bVar5 = false;
              }
              QVariant::~QVariant((QVariant *)&aStack_80);
              QVariant::~QVariant(this);
              if (!bVar5) goto LAB_005e821b;
            }
            else {
              local_268._24_4_ = local_268._24_4_ + 1;
              local_108._0_8_ =
                   (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)
                   0xaaaaaaaa00000000;
              local_108._8_8_ = (Symbol *)0x0;
              local_108._16_8_ = (undefined1 *)0x0;
              local_108._24_8_ = 0;
              local_e8.linear.x1 = 9.88131291682493e-324;
              QCss::Parser::parseTerm((Parser *)local_268,(Value *)local_108);
              QVar43.m_data = &DAT_00000006;
              QVar43.m_size = (qsizetype)&local_228;
              iVar15 = QString::compare(QVar43,0x6d48b4);
              if (iVar15 == 0) {
                QVariant::toString();
                QVar46.m_data = (storage_type_conflict *)aStack_80.shared;
                QVar46.m_size = aStack_80._8_8_;
                iVar7 = QtPrivate::QStringList_indexOf
                                  ((QList_conflict *)&local_1e8,QVar46,0,CaseSensitive);
LAB_005e846b:
                if (local_88 != (undefined1  [8])0x0) {
                  LOCK();
                  *(int *)local_88 = *(int *)local_88 + -1;
                  UNLOCK();
                  if (*(int *)local_88 == 0) {
                    QArrayData::deallocate((QArrayData *)local_88,2,0x10);
                  }
                }
              }
              else {
                QVar44.m_data = (char *)0xe;
                QVar44.m_size = (qsizetype)&local_228;
                iVar15 = QString::compare(QVar44,0x6d48bb);
                if (iVar15 == 0) {
                  QVariant::toString();
                  QVar47.m_data = (storage_type_conflict *)aStack_80.shared;
                  QVar47.m_size = aStack_80._8_8_;
                  CVar8 = QtPrivate::QStringList_indexOf
                                    ((QList_conflict *)&local_208,QVar47,0,CaseSensitive);
                  goto LAB_005e846b;
                }
                uVar25 = QVariant::toReal((bool *)this);
                QHash<QString,double>::tryEmplace_impl<QString_const&>
                          ((TryEmplaceResult *)local_88,(QHash<QString,double> *)&local_1f0,
                           &local_228);
                lVar14 = ((ulong)aStack_80.shared >> 7) * 0x90;
                *(undefined8 *)
                 (*(long *)(*(long *)((long)local_88 + 0x20) + 0x80 + lVar14) + 0x18 +
                 (ulong)*(byte *)((ulong)((uint)aStack_80.shared & 0x7f) +
                                 *(long *)((long)local_88 + 0x20) + lVar14) * 0x20) = uVar25;
              }
              QVariant::~QVariant(this);
            }
            lVar18 = (long)(int)local_268._24_4_;
            lVar14 = local_268._16_8_ - lVar18;
            if (lVar14 != 0 && lVar18 <= (long)local_268._16_8_) {
              pSVar16 = (Symbol *)(local_268._8_8_ + lVar18 * 0x28);
              iVar15 = local_268._24_4_;
              do {
                iVar15 = iVar15 + 1;
                if (pSVar16->token != S) break;
                local_268._24_4_ = iVar15;
                pSVar16 = pSVar16 + 1;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
            bVar5 = true;
            if (((long)(int)local_268._24_4_ < (long)local_268._16_8_) &&
               (((Symbol *)(local_268._8_8_ + (long)(int)local_268._24_4_ * 0x28))->token == COMMA))
            {
              local_268._24_4_ = local_268._24_4_ + 1;
            }
          }
          else {
            QBrush::QBrush((QBrush *)v);
            (v->variant).d.data._forAlignment = 8.39911597930119e-323;
LAB_005e821b:
            bVar5 = false;
          }
          if ((QBrushData *)local_228.d.d != (QBrushData *)0x0) {
            LOCK();
            ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (!bVar5) goto LAB_005e86a3;
        }
        if (iVar6 == 2) {
          puVar19 = &DAT_006d4698;
          puVar20 = (undefined8 *)local_108;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6d48d3;
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar23 = 0;
            uVar27 = 0;
          }
          else {
            uVar23 = SUB84(*pdVar11,0);
            uVar27 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_228.d.d = (Data *)0x2;
          local_228.d.ptr = L"cy";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar24 = 0;
            uVar28 = 0;
          }
          else {
            uVar24 = SUB84(*pdVar11,0);
            uVar28 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_148._0_8_ = &DAT_00000005;
          local_148._8_8_ = "angle";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            dVar29 = 0.0;
          }
          else {
            dVar29 = *pdVar11;
          }
          QConicalGradient::QConicalGradient
                    ((QConicalGradient *)local_108,(qreal)CONCAT44(uVar27,uVar23),
                     (qreal)CONCAT44(uVar28,uVar24),dVar29);
          CVar17 = ObjectBoundingMode;
          if (-1 < (int)CVar8) {
            CVar17 = CVar8;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar17);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar7 != -1) {
            local_108._4_4_ = iVar7;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar2) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
        else if (iVar6 == 1) {
          puVar19 = &DAT_006d4640;
          puVar20 = (undefined8 *)local_108;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6d48d3;
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar23 = 0;
            uVar27 = 0;
          }
          else {
            uVar23 = SUB84(*pdVar11,0);
            uVar27 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_228.d.d = (Data *)0x2;
          local_228.d.ptr = L"cy";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar24 = 0;
            uVar28 = 0;
          }
          else {
            uVar24 = SUB84(*pdVar11,0);
            uVar28 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_148._0_8_ = &DAT_00000006;
          local_148._8_8_ = "radius";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar22 = 0;
            uVar26 = 0;
          }
          else {
            uVar22 = SUB84(*pdVar11,0);
            uVar26 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_168.first._0_4_ = 2;
          local_168.first._4_2_ = 0;
          local_168.first._6_2_ = 0;
          local_168.second.cspec = 0x6d48dd;
          local_168.second.ct.argb.alpha = 0;
          local_168.second.ct.argb.red = 0;
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_168),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            dVar29 = 0.0;
          }
          else {
            dVar29 = *pdVar11;
          }
          local_278.m_size = 2;
          local_278.m_data = "fy";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,&local_278),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            dVar30 = 0.0;
          }
          else {
            dVar30 = *pdVar11;
          }
          QRadialGradient::QRadialGradient
                    ((QRadialGradient *)local_108,(qreal)CONCAT44(uVar27,uVar23),
                     (qreal)CONCAT44(uVar28,uVar24),(qreal)CONCAT44(uVar26,uVar22),dVar29,dVar30);
          CVar17 = ObjectBoundingMode;
          if (-1 < (int)CVar8) {
            CVar17 = CVar8;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar17);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar7 != -1) {
            local_108._4_4_ = iVar7;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar2) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
        else {
          if (iVar6 != 0) goto LAB_005e8693;
          puVar19 = &DAT_006d45e8;
          puVar20 = (undefined8 *)local_108;
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
          }
          local_88 = (undefined1  [8])0x2;
          aStack_80.shared = (PrivateShared *)0x6d48ca;
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_88),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar23 = 0;
            uVar27 = 0;
          }
          else {
            uVar23 = SUB84(*pdVar11,0);
            uVar27 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_228.d.d = (Data *)0x2;
          local_228.d.ptr = L"y1";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_228),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            uVar24 = 0;
            uVar28 = 0;
          }
          else {
            uVar24 = SUB84(*pdVar11,0);
            uVar28 = (undefined4)((ulong)*pdVar11 >> 0x20);
          }
          local_148._0_8_ = (QBrushData *)0x2;
          local_148._8_8_ = "x2";
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)local_148),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            dVar29 = 0.0;
          }
          else {
            dVar29 = *pdVar11;
          }
          local_168.first._0_4_ = 2;
          local_168.first._4_2_ = 0;
          local_168.first._6_2_ = 0;
          local_168.second.cspec = 0x6d48d0;
          local_168.second.ct.argb.alpha = 0;
          local_168.second.ct.argb.red = 0;
          if ((local_1f0.d == (Data<QHashPrivate::Node<QString,_double>_> *)0x0) ||
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_double>_>::
                        findNode<QLatin1String>(local_1f0.d,(QLatin1String *)&local_168),
             pNVar10 == (Node<QString,_double> *)0x0)) {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = &pNVar10->value;
          }
          if (pdVar11 == (double *)0x0) {
            dVar30 = 0.0;
          }
          else {
            dVar30 = *pdVar11;
          }
          QLinearGradient::QLinearGradient
                    ((QLinearGradient *)local_108,(qreal)CONCAT44(uVar27,uVar23),
                     (qreal)CONCAT44(uVar28,uVar24),dVar29,dVar30);
          CVar17 = ObjectBoundingMode;
          if (-1 < (int)CVar8) {
            CVar17 = CVar8;
          }
          QGradient::setCoordinateMode((QGradient *)local_108,CVar17);
          QGradient::setStops((QGradient *)local_108,&local_1c8);
          if (iVar7 != -1) {
            local_108._4_4_ = iVar7;
          }
          *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
          (v->variant).d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_88,(QGradient *)local_108);
          QBrush::QBrush((QBrush *)v,(QBrush *)local_88);
          (v->variant).d.data.shared = (PrivateShared *)0x100000011;
          QBrush::~QBrush((QBrush *)local_88);
          if (bVar2) {
            *(undefined4 *)((long)&(v->variant).d.data + 4) = 3;
          }
          QRadialGradient::~QRadialGradient((QRadialGradient *)local_108);
        }
LAB_005e86a3:
        if (pQStack_240 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_240->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_240,2,0x10);
          }
        }
        QArrayDataPointer<QCss::Symbol>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Symbol> *)local_268);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1e8);
        if ((QBrushData *)local_1c8.d.d != (QBrushData *)0x0) {
          LOCK();
          ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,0x18,0x10);
          }
        }
        QHash<QString,_double>::~QHash(&local_1f0);
        goto LAB_005e8720;
      }
      QBrush::QBrush((QBrush *)v);
      (v->variant).d.data._forAlignment = 8.39911597930119e-323;
LAB_005e8720:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
    }
    else {
      QBrush::QBrush((QBrush *)v);
      (v->variant).d.data._forAlignment = 8.39911597930119e-323;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
    uVar25 = extraout_RDX_02;
  }
  else {
    QBrush::QBrush((QBrush *)v);
    (v->variant).d.data._forAlignment = 8.39911597930119e-323;
    uVar25 = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  BVar48.role = (int)uVar25;
  BVar48.type = (int)((ulong)uVar25 >> 0x20);
  BVar48.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)v;
  return BVar48;
}

Assistant:

static BrushData parseBrushValue(const QCss::Value &v, const QPalette &pal)
{
    ColorData c = parseColorValue(v);
    if (c.type == ColorData::Color) {
        return QBrush(c.color);
    } else if (c.type == ColorData::Role) {
        return c.role;
    }

    if (v.type != Value::Function)
        return BrushData();

    QStringList lst = v.variant.toStringList();
    if (lst.size() != 2)
        return BrushData();

    QStringList gradFuncs;
    gradFuncs << "qlineargradient"_L1 << "qradialgradient"_L1 << "qconicalgradient"_L1 << "qgradient"_L1;
    int gradType = -1;

    if ((gradType = gradFuncs.indexOf(lst.at(0).toLower())) == -1)
        return BrushData();

    QHash<QString, qreal> vars;
    QList<QGradientStop> stops;

    int spread = -1;
    QStringList spreads;
    spreads << "pad"_L1 << "reflect"_L1 << "repeat"_L1;

    int coordinateMode = -1;
    QStringList coordinateModes;
    coordinateModes << "logical"_L1 << "stretchtodevice"_L1 << "objectbounding"_L1 << "object"_L1;

    bool dependsOnThePalette = false;
    Parser parser(lst.at(1));
    while (parser.hasNext()) {
        parser.skipSpace();
        if (!parser.test(IDENT))
            return BrushData();
        QString attr = parser.lexem();
        parser.skipSpace();
        if (!parser.test(COLON))
            return BrushData();
        parser.skipSpace();
        if (attr.compare("stop"_L1, Qt::CaseInsensitive) == 0) {
            QCss::Value stop, color;
            parser.next();
            if (!parser.parseTerm(&stop)) return BrushData();
            parser.skipSpace();
            parser.next();
            if (!parser.parseTerm(&color)) return BrushData();
            ColorData cd = parseColorValue(color);
            if (cd.type == ColorData::Role)
                dependsOnThePalette = true;
            stops.append(QGradientStop(stop.variant.toReal(), colorFromData(cd, pal)));
        } else {
            parser.next();
            QCss::Value value;
            (void)parser.parseTerm(&value);
            if (attr.compare("spread"_L1, Qt::CaseInsensitive) == 0)
                spread = spreads.indexOf(value.variant.toString());
            else if (attr.compare("coordinatemode"_L1, Qt::CaseInsensitive) == 0)
                coordinateMode = coordinateModes.indexOf(value.variant.toString());
            else
                vars[attr] = value.variant.toReal();
        }
        parser.skipSpace();
        (void)parser.test(COMMA);
    }

    if (gradType == 0) {
        QLinearGradient lg(vars.value("x1"_L1), vars.value("y1"_L1),
                           vars.value("x2"_L1), vars.value("y2"_L1));
        lg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        lg.setStops(stops);
        if (spread != -1)
            lg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(lg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 1) {
        QRadialGradient rg(vars.value("cx"_L1), vars.value("cy"_L1),
                           vars.value("radius"_L1), vars.value("fx"_L1),
                           vars.value("fy"_L1));
        rg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        rg.setStops(stops);
        if (spread != -1)
            rg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(rg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 2) {
        QConicalGradient cg(vars.value("cx"_L1), vars.value("cy"_L1), vars.value("angle"_L1));
        cg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        cg.setStops(stops);
        if (spread != -1)
            cg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(cg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    return BrushData();
}